

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cse_optimizer.cpp
# Opt level: O3

void __thiscall
duckdb::CommonSubExpressionOptimizer::VisitOperator
          (CommonSubExpressionOptimizer *this,LogicalOperator *op)

{
  if ((op->type | LOGICAL_FILTER) == LOGICAL_AGGREGATE_AND_GROUP_BY) {
    ExtractCommonSubExpresions(this,op);
  }
  LogicalOperatorVisitor::VisitOperator(&this->super_LogicalOperatorVisitor,op);
  return;
}

Assistant:

void CommonSubExpressionOptimizer::VisitOperator(LogicalOperator &op) {
	switch (op.type) {
	case LogicalOperatorType::LOGICAL_PROJECTION:
	case LogicalOperatorType::LOGICAL_AGGREGATE_AND_GROUP_BY:
		ExtractCommonSubExpresions(op);
		break;
	default:
		break;
	}
	LogicalOperatorVisitor::VisitOperator(op);
}